

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

bool __thiscall
crnlib::symbol_codec::decode_receive_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,
          static_huffman_data_model *pDeltaModel)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  byte *pbVar7;
  uint local_a8;
  uint local_a4;
  int codesize;
  uint i_1;
  uint n;
  uint end;
  uint prev;
  uint len_2;
  uint len_1;
  uint len;
  uint code;
  uint num_remaining;
  uint ofs;
  uint i;
  undefined1 local_68 [8];
  static_huffman_data_model dm;
  uint num_codelength_codes_to_send;
  uint total_used_syms;
  static_huffman_data_model *pDeltaModel_local;
  static_huffman_data_model *model_local;
  symbol_codec *this_local;
  
  uVar4 = math::total_bits(0x2000);
  dm._52_4_ = decode_bits(this,uVar4);
  if (dm._52_4_ == 0) {
    static_huffman_data_model::clear(model);
    this_local._7_1_ = true;
  }
  else {
    vector<unsigned_char>::resize(&model->m_code_sizes,dm._52_4_,false);
    puVar6 = vector<unsigned_char>::operator[](&model->m_code_sizes,0);
    memset(puVar6,0,(ulong)(uint)dm._52_4_);
    dm._48_4_ = decode_bits(this,5);
    if ((dm._48_4_ == 0) || (0x15 < (uint)dm._48_4_)) {
      this_local._7_1_ = false;
    }
    else {
      static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)local_68);
      vector<unsigned_char>::resize((vector<unsigned_char> *)&dm.m_codes.m_size,0x15,false);
      for (ofs = 0; ofs < (uint)dm._48_4_; ofs = ofs + 1) {
        uVar4 = decode_bits(this,3);
        puVar6 = vector<unsigned_char>::operator[]
                           ((vector<unsigned_char> *)&dm.m_codes.m_size,
                            (uint)(byte)g_most_probable_codelength_codes[ofs]);
        *puVar6 = (uchar)uVar4;
      }
      bVar3 = static_huffman_data_model::prepare_decoder_tables
                        ((static_huffman_data_model *)local_68);
      if (bVar3) {
        code = 0;
        while (code < (uint)dm._52_4_) {
          uVar5 = dm._52_4_ - code;
          uVar4 = decode(this,(static_huffman_data_model *)local_68);
          if (uVar4 < 0x11) {
            len_1._0_1_ = (uchar)uVar4;
            puVar6 = vector<unsigned_char>::operator[](&model->m_code_sizes,code);
            *puVar6 = (uchar)len_1;
            code = code + 1;
          }
          else if (uVar4 == 0x11) {
            uVar4 = decode_bits(this,3);
            if (uVar5 < uVar4 + 3) {
              this_local._7_1_ = false;
              goto LAB_002153e7;
            }
            code = uVar4 + 3 + code;
          }
          else if (uVar4 == 0x12) {
            uVar4 = decode_bits(this,7);
            if (uVar5 < uVar4 + 0xb) {
              this_local._7_1_ = false;
              goto LAB_002153e7;
            }
            code = uVar4 + 0xb + code;
          }
          else {
            if ((uVar4 != 0x13) && (uVar4 != 0x14)) {
              this_local._7_1_ = false;
              goto LAB_002153e7;
            }
            if (uVar4 == 0x13) {
              uVar4 = decode_bits(this,2);
              end = uVar4 + 3;
            }
            else {
              uVar4 = decode_bits(this,6);
              end = uVar4 + 7;
            }
            if ((code == 0) || (uVar5 < end)) {
              this_local._7_1_ = false;
              goto LAB_002153e7;
            }
            puVar6 = vector<unsigned_char>::operator[](&model->m_code_sizes,code - 1);
            uVar1 = *puVar6;
            if (uVar1 == '\0') {
              this_local._7_1_ = false;
              goto LAB_002153e7;
            }
            uVar5 = code + end;
            while (code < uVar5) {
              puVar6 = vector<unsigned_char>::operator[](&model->m_code_sizes,code);
              *puVar6 = uVar1;
              code = code + 1;
            }
          }
        }
        if (code == dm._52_4_) {
          if ((pDeltaModel != (static_huffman_data_model *)0x0) &&
             (uVar4 = static_huffman_data_model::get_total_syms(pDeltaModel), uVar4 != 0)) {
            uVar4 = vector<unsigned_char>::size(&pDeltaModel->m_code_sizes);
            uVar5 = math::minimum<unsigned_int>(uVar4,dm._52_4_);
            for (local_a4 = 0; local_a4 < uVar5; local_a4 = local_a4 + 1) {
              pbVar7 = vector<unsigned_char>::operator[](&model->m_code_sizes,local_a4);
              bVar2 = *pbVar7;
              pbVar7 = vector<unsigned_char>::operator[](&pDeltaModel->m_code_sizes,local_a4);
              local_a8 = (uint)bVar2 + (uint)*pbVar7;
              if (0x10 < local_a8) {
                local_a8 = local_a8 - 0x11;
              }
              puVar6 = vector<unsigned_char>::operator[](&model->m_code_sizes,local_a4);
              *puVar6 = (uchar)local_a8;
            }
          }
          this_local._7_1_ = static_huffman_data_model::prepare_decoder_tables(model);
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
LAB_002153e7:
      static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)local_68);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool symbol_codec::decode_receive_static_huffman_data_model(static_huffman_data_model& model, static_huffman_data_model* pDeltaModel)
    {
        CRNLIB_ASSERT(m_mode == cDecoding);

        const uint total_used_syms = decode_bits(math::total_bits(prefix_coding::cMaxSupportedSyms));
        if (!total_used_syms)
        {
            model.clear();
            return true;
        }

        model.m_code_sizes.resize(total_used_syms);
        memset(&model.m_code_sizes[0], 0, sizeof(model.m_code_sizes[0]) * total_used_syms);

        const uint num_codelength_codes_to_send = decode_bits(5);
        if ((num_codelength_codes_to_send < 1) || (num_codelength_codes_to_send > cMaxCodelengthCodes))
        {
            return false;
        }

        static_huffman_data_model dm;
        dm.m_code_sizes.resize(cMaxCodelengthCodes);

        for (uint i = 0; i < num_codelength_codes_to_send; i++)
        {
            dm.m_code_sizes[g_most_probable_codelength_codes[i]] = static_cast<uint8>(decode_bits(3));
        }

        if (!dm.prepare_decoder_tables())
        {
            return false;
        }

        uint ofs = 0;
        while (ofs < total_used_syms)
        {
            const uint num_remaining = total_used_syms - ofs;

            uint code = decode(dm);
            if (code <= 16)
            {
                model.m_code_sizes[ofs++] = static_cast<uint8>(code);
            }
            else if (code == cSmallZeroRunCode)
            {
                uint len = decode_bits(cSmallZeroRunExtraBits) + cMinSmallZeroRunSize;
                if (len > num_remaining)
                {
                    return false;
                }
                ofs += len;
            }
            else if (code == cLargeZeroRunCode)
            {
                uint len = decode_bits(cLargeZeroRunExtraBits) + cMinLargeZeroRunSize;
                if (len > num_remaining)
                {
                    return false;
                }
                ofs += len;
            }
            else if ((code == cSmallRepeatCode) || (code == cLargeRepeatCode))
            {
                uint len;
                if (code == cSmallRepeatCode)
                {
                    len = decode_bits(cSmallNonZeroRunExtraBits) + cSmallMinNonZeroRunSize;
                }
                else
                {
                    len = decode_bits(cLargeNonZeroRunExtraBits) + cLargeMinNonZeroRunSize;
                }

                if ((!ofs) || (len > num_remaining))
                {
                    return false;
                }
                const uint prev = model.m_code_sizes[ofs - 1];
                if (!prev)
                {
                    return false;
                }
                const uint end = ofs + len;
                while (ofs < end)
                {
                    model.m_code_sizes[ofs++] = static_cast<uint8>(prev);
                }
            }
            else
            {
                CRNLIB_ASSERT(0);
                return false;
            }
        }

        if (ofs != total_used_syms)
        {
            return false;
        }

        if ((pDeltaModel) && (pDeltaModel->get_total_syms()))
        {
            uint n = math::minimum(pDeltaModel->m_code_sizes.size(), total_used_syms);
            for (uint i = 0; i < n; i++)
            {
                int codesize = model.m_code_sizes[i] + pDeltaModel->m_code_sizes[i];
                if (codesize > 16)
                {
                    codesize -= 17;
                }
                model.m_code_sizes[i] = static_cast<uint8>(codesize);
            }
        }

        return model.prepare_decoder_tables();
    }